

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

int deqp::gles31::Functional::anon_unknown_0::getLastFullLevel(ImageInfo *info)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong in_RCX;
  uint uVar4;
  uint level;
  IVec3 levelSize;
  IVec3 blockPixelSize;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  uVar1 = getLevelCount(info);
  getTexelBlockPixelSize((anon_unknown_0 *)&local_3c,info->m_format);
  level = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  do {
    iVar3 = (int)in_RCX;
    if (uVar4 == level) {
LAB_013a0b05:
      iVar2 = uVar1 - 1;
      if ((int)level < (int)uVar1) {
        iVar2 = iVar3;
      }
      return iVar2;
    }
    in_RCX = (ulong)level;
    getLevelSize((anon_unknown_0 *)&local_48,info->m_target,&info->m_size,level);
    if (((local_48 < local_3c) || (local_44 < local_38)) || (local_40 < local_34)) {
      iVar3 = level - 1;
      goto LAB_013a0b05;
    }
    level = level + 1;
  } while( true );
}

Assistant:

int getLastFullLevel (const ImageInfo& info)
{
	const int	levelCount		= getLevelCount(info);
	const IVec3	blockPixelSize	= getTexelBlockPixelSize(info.getFormat());

	for (int level = 0; level < levelCount; level++)
	{
		const IVec3 levelSize = getLevelSize(info.getTarget(), info.getSize(), level);

		if (levelSize.x() < blockPixelSize.x() || levelSize.y() < blockPixelSize.y() || levelSize.z() < blockPixelSize.z())
			return level - 1;
	}

	return levelCount -1;
}